

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O3

MessageBuilder * __thiscall
doctest::detail::MessageBuilder::operator_(MessageBuilder *this,char (*in) [2])

{
  ostream *s;
  ostream *stream;
  String local_30;
  
  s = this->m_stream;
  stream = tlssPush();
  filldata<const_char[2]>::fill(stream,in);
  tlssPop();
  operator<<(s,&local_30);
  String::~String(&local_30);
  return this;
}

Assistant:

MessageBuilder& operator,(const T& in) {
            *m_stream << (DOCTEST_STRINGIFY(in));
            return *this;
        }